

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3WindowOffsetExpr(Parse *pParse,Expr *pExpr)

{
  long in_FS_OFFSET;
  Walker local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
  local_50.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
  local_50.walkerDepth = -0x55555556;
  local_50.eCode = 1;
  local_50.mWFlags = 0xaaaa;
  local_50.pParse = (Parse *)0x0;
  local_50.xExprCallback = exprNodeIsConstant;
  local_50.xSelectCallback = sqlite3SelectWalkFail;
  if (pExpr != (Expr *)0x0) {
    sqlite3WalkExprNN(&local_50,pExpr);
    if (local_50.eCode != 0) goto LAB_001ae436;
    if (1 < pParse->eParseMode) {
      sqlite3RenameExprUnmap(pParse,pExpr);
    }
    sqlite3ExprDeleteNN(pParse->db,pExpr);
    pExpr = (Expr *)sqlite3DbMallocRawNN(pParse->db,0x48);
    if (pExpr != (Expr *)0x0) {
      pExpr->op = '\0';
      pExpr->affExpr = '\0';
      pExpr->op2 = '\0';
      pExpr->field_0x3 = 0;
      pExpr->flags = 0;
      (pExpr->u).zToken = (char *)0x0;
      pExpr->iColumn = 0;
      pExpr->iAgg = 0;
      pExpr->w = (anon_union_4_2_009eaf8f_for_w)0x0;
      pExpr->pAggInfo = (AggInfo *)0x0;
      (pExpr->x).pList = (ExprList *)0x0;
      pExpr->nHeight = 0;
      pExpr->iTable = 0;
      pExpr->pLeft = (Expr *)0x0;
      pExpr->pRight = (Expr *)0x0;
      (pExpr->y).pTab = (Table *)0x0;
      pExpr->op = 'z';
      pExpr->iAgg = -1;
      pExpr->nHeight = 1;
      goto LAB_001ae436;
    }
  }
  pExpr = (Expr *)0x0;
LAB_001ae436:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pExpr;
  }
  __stack_chk_fail();
}

Assistant:

static Expr *sqlite3WindowOffsetExpr(Parse *pParse, Expr *pExpr){
  if( 0==sqlite3ExprIsConstant(0,pExpr) ){
    if( IN_RENAME_OBJECT ) sqlite3RenameExprUnmap(pParse, pExpr);
    sqlite3ExprDelete(pParse->db, pExpr);
    pExpr = sqlite3ExprAlloc(pParse->db, TK_NULL, 0, 0);
  }
  return pExpr;
}